

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

int cuddHashTableInsert(DdHashTable *hash,DdNodePtr *key,DdNode *value,ptrint count)

{
  int iVar1;
  uint uVar2;
  DdHashItem *pDVar3;
  uint local_44;
  uint i;
  DdHashItem *item;
  uint posn;
  int result;
  ptrint count_local;
  DdNode *value_local;
  DdNodePtr *key_local;
  DdHashTable *hash_local;
  
  if ((hash->maxsize < hash->size) && (iVar1 = cuddHashTableResize(hash), iVar1 == 0)) {
    hash_local._4_4_ = 0;
  }
  else {
    pDVar3 = cuddHashTableAlloc(hash);
    if (pDVar3 == (DdHashItem *)0x0) {
      hash_local._4_4_ = 0;
    }
    else {
      hash->size = hash->size + 1;
      pDVar3->value = value;
      *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)value & 0xfffffffffffffffe) + 4) + 1;
      pDVar3->count = count;
      for (local_44 = 0; local_44 < hash->keysize; local_44 = local_44 + 1) {
        pDVar3->key[local_44] = key[local_44];
      }
      uVar2 = ddLCHash(key,hash->keysize,hash->shift);
      pDVar3->next = hash->bucket[uVar2];
      hash->bucket[uVar2] = pDVar3;
      hash_local._4_4_ = 1;
    }
  }
  return hash_local._4_4_;
}

Assistant:

int
cuddHashTableInsert(
  DdHashTable * hash,
  DdNodePtr * key,
  DdNode * value,
  ptrint count)
{
    int result;
    unsigned int posn;
    DdHashItem *item;
    unsigned int i;

#ifdef DD_DEBUG
    assert(hash->keysize > 3);
#endif

    if (hash->size > hash->maxsize) {
        result = cuddHashTableResize(hash);
        if (result == 0) return(0);
    }
    item = cuddHashTableAlloc(hash);
    if (item == NULL) return(0);
    hash->size++;
    item->value = value;
    cuddRef(value);
    item->count = count;
    for (i = 0; i < hash->keysize; i++) {
        item->key[i] = key[i];
    }
    posn = ddLCHash(key,hash->keysize,hash->shift);
    item->next = hash->bucket[posn];
    hash->bucket[posn] = item;

    return(1);

}